

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

Script * cfd::core::ScriptUtil::CreateP2pkhLockingScript
                   (Script *__return_storage_ptr__,Pubkey *pubkey)

{
  undefined1 local_30 [8];
  ByteData160 pubkey_hash;
  Pubkey *pubkey_local;
  
  pubkey_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pubkey;
  HashUtil::Hash160((ByteData160 *)local_30,pubkey);
  CreateP2pkhLockingScript(__return_storage_ptr__,(ByteData160 *)local_30);
  ByteData160::~ByteData160((ByteData160 *)0x4012c4);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2pkhLockingScript(const Pubkey& pubkey) {
  // create pubkey hash
  ByteData160 pubkey_hash = HashUtil::Hash160(pubkey);

  return CreateP2pkhLockingScript(pubkey_hash);
}